

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestCase *_testCase,string *_className,
                   string *_name,string *_descOrTags,SourceLineInfo *_lineInfo)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  undefined1 local_290 [8];
  TestCaseInfo info;
  allocator local_169;
  string local_168 [32];
  _Base_ptr local_148;
  undefined1 local_140;
  allocator local_131;
  string local_130 [32];
  _Base_ptr local_110;
  undefined1 local_108;
  char local_f9;
  ulong uStack_f8;
  char c;
  size_t i;
  string local_e8 [7];
  bool inTag;
  string tag;
  string local_c8 [8];
  string desc;
  undefined1 local_a8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  allocator local_61;
  string local_60 [39];
  byte local_39;
  SourceLineInfo *pSStack_38;
  bool isHidden;
  SourceLineInfo *_lineInfo_local;
  string *_descOrTags_local;
  string *_name_local;
  string *_className_local;
  ITestCase *_testCase_local;
  
  pSStack_38 = _lineInfo;
  _lineInfo_local = (SourceLineInfo *)_descOrTags;
  _descOrTags_local = _name;
  _name_local = _className;
  _className_local = (string *)_testCase;
  _testCase_local = (ITestCase *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"./",&local_61);
  bVar2 = startsWith(_name,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_39 = bVar2;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_a8);
  std::__cxx11::string::string(local_c8);
  std::__cxx11::string::string(local_e8);
  i._7_1_ = 0;
  for (uStack_f8 = 0; uVar1 = uStack_f8, uVar3 = std::__cxx11::string::size(), uVar1 < uVar3;
      uStack_f8 = uStack_f8 + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)_lineInfo_local);
    local_f9 = *pcVar4;
    if ((i._7_1_ & 1) == 0) {
      if (local_f9 == '[') {
        i._7_1_ = 1;
      }
      else {
        std::__cxx11::string::operator+=(local_c8,local_f9);
      }
    }
    else if (local_f9 == ']') {
      enforceNotReservedTag((string *)local_e8,pSStack_38);
      i._7_1_ = 0;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_e8,"hide");
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_e8,"."), bVar2)) {
        local_39 = 1;
      }
      else {
        pVar5 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_a8,(value_type *)local_e8);
        local_110 = (_Base_ptr)pVar5.first._M_node;
        local_108 = pVar5.second;
      }
      std::__cxx11::string::clear();
    }
    else {
      std::__cxx11::string::operator+=(local_e8,local_f9);
    }
  }
  if ((local_39 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"hide",&local_131);
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_a8,(value_type *)local_130);
    local_148 = (_Base_ptr)pVar5.first._M_node;
    local_140 = pVar5.second;
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,".",&local_169);
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_a8,(value_type *)local_168);
    info._264_8_ = pVar5.first._M_node;
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)local_290,_descOrTags_local,_name_local,(string *)local_c8,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8,pSStack_38);
  TestCase::TestCase(__return_storage_ptr__,(ITestCase *)_className_local,(TestCaseInfo *)local_290)
  ;
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)local_290);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_c8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

TestCase makeTestCase(  ITestCase* _testCase,
                            std::string const& _className,
                            std::string const& _name,
                            std::string const& _descOrTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden( startsWith( _name, "./" ) ); // Legacy support

        // Parse out tags
        std::set<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        for( std::size_t i = 0; i < _descOrTags.size(); ++i ) {
            char c = _descOrTags[i];
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    enforceNotReservedTag( tag, _lineInfo );

                    inTag = false;
                    if( tag == "hide" || tag == "." )
                        isHidden = true;
                    else
                        tags.insert( tag );
                    tag.clear();
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            tags.insert( "hide" );
            tags.insert( "." );
        }

        TestCaseInfo info( _name, _className, desc, tags, _lineInfo );
        return TestCase( _testCase, info );
    }